

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__pnm_skip_whitespace(stbi__context *s,char *c)

{
  stbi_uc sVar1;
  int iVar2;
  stbi_uc *in_RSI;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  
  while( true ) {
    iVar2 = stbi__at_eof((stbi__context *)
                         CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
    in_stack_ffffffffffffffef = false;
    if (iVar2 == 0) {
      iVar2 = stbi__pnm_isspace(*in_RSI);
      in_stack_ffffffffffffffef = iVar2 != 0;
    }
    if ((bool)in_stack_ffffffffffffffef == false) break;
    sVar1 = stbi__get8((stbi__context *)
                       CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
    *in_RSI = sVar1;
  }
  return;
}

Assistant:

static void     stbi__pnm_skip_whitespace(stbi__context *s, char *c)
{
   while (!stbi__at_eof(s) && stbi__pnm_isspace(*c))
      *c = (char) stbi__get8(s);
}